

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circuit.cpp
# Opt level: O0

void create_line_undo_proc(Am_Object *cmd)

{
  byte bVar1;
  int iVar2;
  Am_Value *pAVar3;
  Am_Value *pAVar4;
  Am_Wrapper *pAVar5;
  ushort local_44;
  int where_in_o2;
  Am_Object o2;
  undefined1 local_28 [8];
  Am_Value has_been_undone;
  Am_Object line;
  Am_Object *cmd_local;
  
  pAVar3 = (Am_Value *)Am_Object::Get((ushort)cmd,0x16d);
  Am_Object::Am_Object((Am_Object *)&has_been_undone.value,pAVar3);
  Am_Value::Am_Value((Am_Value *)local_28);
  pAVar4 = Am_Object::Peek(cmd,0x16f,0);
  Am_Value::operator=((Am_Value *)local_28,(Am_Value *)pAVar4);
  bVar1 = Am_Value::Valid();
  Am_Object::Set((ushort)cmd,true,(ulong)((byte)~bVar1 & 1));
  bVar1 = Am_Object::Valid();
  if ((bVar1 & 1) != 0) {
    Am_Object::Am_Object((Am_Object *)&stack0xffffffffffffffc0);
    bVar1 = Am_Value::Valid();
    if ((bVar1 & 1) == 0) {
      pAVar3 = (Am_Value *)Am_Object::Get((short)&has_been_undone + 8,(ulong)INPUT_1);
      Am_Object::operator=((Am_Object *)&stack0xffffffffffffffc0,pAVar3);
      clean_other_for_line
                ((Am_Object *)&stack0xffffffffffffffc0,(Am_Object *)&has_been_undone.value,INPUT_WAS
                );
      pAVar3 = (Am_Value *)Am_Object::Get((short)&has_been_undone + 8,(ulong)OUTPUT_1);
      Am_Object::operator=((Am_Object *)&stack0xffffffffffffffc0,pAVar3);
      clean_other_for_line
                ((Am_Object *)&stack0xffffffffffffffc0,(Am_Object *)&has_been_undone.value,
                 OUTPUT_WAS);
    }
    else {
      pAVar3 = (Am_Value *)Am_Object::Get((short)&has_been_undone + 8,(ulong)OUTPUT_1);
      Am_Object::operator=((Am_Object *)&stack0xffffffffffffffc0,pAVar3);
      pAVar4 = (Am_Value *)Am_Object::Get((short)&has_been_undone + 8,(ulong)OUTPUT_WAS);
      iVar2 = Am_Value::operator_cast_to_int(pAVar4);
      local_44 = (ushort)iVar2;
      pAVar5 = Am_Object::operator_cast_to_Am_Wrapper_((Am_Object *)&has_been_undone.value);
      Am_Object::Set((ushort)&stack0xffffffffffffffc0,(Am_Wrapper *)(ulong)local_44,(ulong)pAVar5);
      pAVar3 = (Am_Value *)Am_Object::Get((short)&has_been_undone + 8,(ulong)INPUT_1);
      Am_Object::operator=((Am_Object *)&stack0xffffffffffffffc0,pAVar3);
      line_for_list((Am_Object *)&stack0xffffffffffffffc0,(Am_Object *)&has_been_undone.value,false)
      ;
    }
    Am_Object::~Am_Object((Am_Object *)&stack0xffffffffffffffc0);
  }
  Am_Value::~Am_Value((Am_Value *)local_28);
  Am_Object::~Am_Object((Am_Object *)&has_been_undone.value);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, create_line_undo,
		 (Am_Object cmd)) {
  Am_Object line = cmd.Get(Am_OBJECT_MODIFIED);
  Am_Value has_been_undone;
  has_been_undone = cmd.Peek(Am_HAS_BEEN_UNDONE);
  cmd.Set(Am_HAS_BEEN_UNDONE, !has_been_undone.Valid());
  if (line.Valid()) {
    // cout << " for line " << line << " cmd " << cmd
    //  << " has_been_undone " << has_been_undone << endl << flush;
    Am_Object o2;
    if (has_been_undone.Valid()) { //becoming visible
      o2 = line.Get(OUTPUT_1);
      int where_in_o2 = (int)line.Get(OUTPUT_WAS);
      o2.Set(where_in_o2, line);
      o2 = line.Get(INPUT_1);
      line_for_list(o2, line, false);
    }
    else { //make it invisible
      o2 = line.Get(INPUT_1);
      clean_other_for_line(o2, line, INPUT_WAS);
      o2 = line.Get(OUTPUT_1);
      clean_other_for_line(o2, line, OUTPUT_WAS);
    }
  }
}